

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t sysbvm_type_createWithName(sysbvm_context_t *context,sysbvm_tuple_t name)

{
  _Bool _Var1;
  sysbvm_tuple_t tuple;
  
  tuple = sysbvm_type_createAnonymous(context);
  if ((tuple & 0xf) == 0 && tuple != 0) {
    _Var1 = sysbvm_tuple_isDummyValue(tuple);
    if (!_Var1) {
      *(sysbvm_tuple_t *)(tuple + 0x10) = name;
    }
  }
  return tuple;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createWithName(sysbvm_context_t *context, sysbvm_tuple_t name)
{
    sysbvm_tuple_t result = sysbvm_type_createAnonymous(context);
    sysbvm_type_setName(result, name);
    return result;
}